

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorTextInstancer::InstanceDecorator
          (DecoratorTextInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *param_3)

{
  Unit UVar1;
  Array<const_Property_*,_2> p_position;
  size_type sVar2;
  int iVar3;
  Colour<unsigned_char,_255,_false> CVar4;
  Property *this_00;
  Property *this_01;
  Property *pPVar5;
  Property *pPVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  Vector2Numeric in_align;
  SharedPtr<Decorator> SVar12;
  String text;
  SharedPtr<Rml::DecoratorText> decorator;
  uint local_a0;
  _Alloc_hider in_stack_ffffffffffffff68;
  Property *in_stack_ffffffffffffff70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  String local_50;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[9]);
  pPVar5 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[10]);
  pPVar6 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[0xb]);
  auVar11._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar11._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)((ulong)pPVar5 >> 0x20) == 0 && (int)pPVar5 == 0);
  auVar11._12_4_ = -(uint)((int)pPVar6 == 0 && (int)((ulong)pPVar6 >> 0x20) == 0);
  iVar3 = movmskps((int)pPVar6,auVar11);
  if (iVar3 == 0) {
    Property::Get<std::__cxx11::string>(&local_78,this_00);
    StringUtilities::DecodeRml((String *)&stack0xffffffffffffff68,&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    if (in_stack_ffffffffffffff70 == (Property *)0x0) {
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      UVar1 = this_01->unit;
      if (UVar1 == COLOUR) {
        CVar4 = Property::Get<Rml::Colour<unsigned_char,255,false>>(this_01);
        uVar9 = (uint)CVar4 & 0xff000000;
        uVar10 = (uint)CVar4 & 0xff0000;
        uVar8 = (uint)CVar4 & 0xff00;
        local_a0 = (uint)CVar4 & 0xff;
      }
      else {
        uVar10 = 0;
        uVar9 = 0xff000000;
        uVar8 = 0;
        local_a0 = 0;
      }
      p_position._M_elems[1] = in_stack_ffffffffffffff70;
      p_position._M_elems[0] = (Property *)in_stack_ffffffffffffff68._M_p;
      in_align = ComputePosition(p_position);
      ::std::make_shared<Rml::DecoratorText>();
      local_50._M_dataplus._M_p = in_stack_ffffffffffffff68._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffff68._M_p == &local_88) {
        local_50.field_2._8_8_ = local_88._8_8_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      local_88._M_local_buf[0] = '\0';
      DecoratorText::Initialise
                ((DecoratorText *)local_78._M_dataplus._M_p,&local_50,UVar1 == KEYWORD,
                 (Colourb)(uVar8 | local_a0 | uVar10 | uVar9),in_align);
      ::std::__cxx11::string::~string((string *)&local_50);
      sVar2 = local_78._M_string_length;
      local_78._M_string_length = 0;
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
           (_func_int **)local_78._M_dataplus._M_p;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar2;
      local_78._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    }
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var7._M_pi = extraout_RDX;
  }
  SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<Decorator>)SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorTextInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& /*instancer_interface*/)
{
	const Property* p_text = properties.GetProperty(ids.text);
	const Property* p_color = properties.GetProperty(ids.color);
	Array<const Property*, 2> p_align = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};
	if (!p_text || !p_color || !p_align[0] || !p_align[1])
		return nullptr;

	String text = StringUtilities::DecodeRml(p_text->Get<String>());
	if (text.empty())
		return nullptr;

	const bool inherit_color = (p_color->unit == Unit::KEYWORD);
	const Colourb color = (p_color->unit == Unit::COLOUR ? p_color->Get<Colourb>() : Colourb{});
	const Vector2Numeric align = ComputePosition(p_align);

	auto decorator = MakeShared<DecoratorText>();
	decorator->Initialise(std::move(text), inherit_color, color, align);
	return decorator;
}